

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::BuildFieldOfTable
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,size_t offset,string *code_ptr)

{
  bool bVar1;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string field_var;
  string *code;
  string *code_ptr_local;
  size_t offset_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  field_var.field_2._8_8_ = code_ptr;
  IdlNamer::Variable_abi_cxx11_((string *)local_58,&this->namer_,field);
  IdlNamer::Type_abi_cxx11_(&local_d8,&this->namer_,struct_def);
  std::operator+(&local_b8,"func ",&local_d8);
  std::operator+(&local_98,&local_b8,"Add");
  IdlNamer::Function_abi_cxx11_(&local_108,&this->namer_,&field->super_Definition);
  std::operator+(&local_78,&local_98,&local_108);
  std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::operator+=
            ((string *)field_var.field_2._8_8_,"(builder *flatbuffers.Builder, ");
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58," ");
  std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  bVar1 = IsScalar((field->value).type.base_type);
  if ((bVar1) || ((struct_def->fixed & 1U) != 0)) {
    GenTypeGet_abi_cxx11_(&local_148,this,&(field->value).type);
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
  }
  else {
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,"flatbuffers.UOffsetT");
  }
  std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,") {\n\t");
  std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,"builder.Prepend");
  GenMethod_abi_cxx11_(&local_168,this,field);
  std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,"(");
  }
  else {
    NumToString<unsigned_long>(&local_1c8,offset);
    std::operator+(&local_1a8,"Slot(",&local_1c8);
    std::operator+(&local_188,&local_1a8,", ");
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  bVar1 = IsScalar((field->value).type.base_type);
  if ((bVar1) || ((struct_def->fixed & 1U) != 0)) {
    std::__cxx11::string::string((string *)&local_248,(string *)local_58);
    CastToBaseType(&local_228,this,&(field->value).type,&local_248);
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
  }
  else {
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,"flatbuffers.UOffsetT");
    std::operator+(&local_208,"(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::operator+(&local_1e8,&local_208,")");
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
  }
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,")\n");
    NumToString<unsigned_long>(&local_288,offset);
    std::operator+(&local_268,"\tbuilder.Slot(",&local_288);
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
  }
  else {
    GenConstant_abi_cxx11_(&local_2c8,this,field);
    std::operator+(&local_2a8,", ",&local_2c8);
    std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,")\n");
  std::__cxx11::string::operator+=((string *)field_var.field_2._8_8_,"}\n");
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void BuildFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                         const size_t offset, std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string field_var = namer_.Variable(field);
    code += "func " + namer_.Type(struct_def) + "Add" + namer_.Function(field);
    code += "(builder *flatbuffers.Builder, ";
    code += field_var + " ";
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.UOffsetT";
    } else {
      code += GenTypeGet(field.value.type);
    }
    code += ") {\n\t";
    code += "builder.Prepend";
    code += GenMethod(field);
    if (field.IsScalarOptional()) {
      code += "(";
    } else {
      code += "Slot(" + NumToString(offset) + ", ";
    }
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.UOffsetT";
      code += "(" + field_var + ")";
    } else {
      code += CastToBaseType(field.value.type, field_var);
    }
    if (field.IsScalarOptional()) {
      code += ")\n";
      code += "\tbuilder.Slot(" + NumToString(offset);
    } else {
      code += ", " + GenConstant(field);
    }
    code += ")\n";
    code += "}\n";
  }